

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O3

void __thiscall
dlib::con_<512l,1l,1l,1,1,0,0>::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,true,void>>
          (con_<512l,1l,1l,1,1,0,0> *this,
          subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  int iVar5;
  float *pfVar6;
  long lVar7;
  undefined4 extraout_var;
  tensor *__range1;
  size_t sVar8;
  float *val;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar9 [16];
  undefined1 extraout_var_01 [56];
  undefined1 auVar11 [64];
  rand rnd;
  alias_tensor_instance local_1440;
  rand local_13f8;
  undefined1 auVar10 [64];
  undefined1 extraout_var_00 [60];
  
  lVar2 = *(long *)(this + 0x168);
  lVar3 = *(long *)((long)(((sub->l->subnetwork)._M_t.
                            super___uniq_ptr_impl<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                            .
                            super__Head_base<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
                           ._M_head_impl)->subnetwork)._M_t + 0x238);
  sVar8 = ((ulong)(byte)this[0x178] + lVar3) * lVar2;
  *(size_t *)(this + 8) = sVar8;
  *(undefined8 *)(this + 0x10) = 1;
  *(undefined8 *)(this + 0x18) = 1;
  *(undefined8 *)(this + 0x20) = 1;
  *(size_t *)(this + 0x28) = sVar8;
  if (*(long *)(this + 0x30) < (long)sVar8) {
    gpu_data::set_size((gpu_data *)(this + 0x30),sVar8);
  }
  ::rand();
  rand::rand(&local_13f8);
  pfVar6 = (float *)(**(code **)(*(long *)this + 0x18))(this);
  lVar7 = (**(code **)(*(long *)this + 0x18))(this);
  auVar10._8_56_ = extraout_var_01;
  auVar10._0_8_ = extraout_XMM0_Qa;
  pfVar1 = (float *)(lVar7 + *(long *)(this + 0x28) * 4);
  if (pfVar6 != pfVar1) {
    auVar9 = vcvtusi2sd_avx512f(auVar10._0_16_,lVar2 + lVar3);
    auVar9._0_8_ = 6.0 / auVar9._0_8_;
    auVar9._8_8_ = 0;
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    do {
      auVar11._0_4_ = rand::get_random_float(&local_13f8);
      auVar11._4_60_ = extraout_var_00;
      auVar4 = vfmadd132ss_fma(auVar11._0_16_,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
      *pfVar6 = (float)((double)auVar4._0_4_ * auVar9._0_8_);
      pfVar6 = pfVar6 + 1;
    } while (pfVar6 != pfVar1);
  }
  lVar2 = *(long *)(this + 0x168);
  lVar3 = *(long *)((long)(((sub->l->subnetwork)._M_t.
                            super___uniq_ptr_impl<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                            .
                            super__Head_base<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
                           ._M_head_impl)->subnetwork)._M_t + 0x238);
  *(long *)(this + 0xa0) = lVar2;
  *(long *)(this + 0xa8) = lVar3;
  sVar8 = lVar3 * lVar2;
  *(undefined8 *)(this + 0xb0) = 1;
  *(undefined8 *)(this + 0xb8) = 1;
  *(size_t *)(this + 0xc0) = sVar8;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  if (this[0x178] == (con_<512l,1l,1l,1,1,0,0>)0x1) {
    *(undefined8 *)(this + 0xe8) = 1;
    *(long *)(this + 0xf0) = lVar2;
    *(undefined8 *)(this + 0xf8) = 1;
    *(undefined8 *)(this + 0x100) = 1;
    *(long *)(this + 0x108) = lVar2;
    *(undefined8 *)(this + 0x110) = 0;
    *(undefined8 *)(this + 0x118) = 0;
    *(undefined8 *)(this + 0x120) = 0;
    alias_tensor::operator()(&local_1440,(alias_tensor *)(this + 0xe0),(tensor *)this,sVar8);
    iVar5 = (*local_1440.super_tensor._vptr_tensor[4])();
    if (local_1440.super_tensor.m_size != 0) {
      memset((void *)CONCAT44(extraout_var,iVar5),0,local_1440.super_tensor.m_size << 2);
    }
  }
  local_13f8._vptr_rand = (_func_int **)&PTR__rand_001fa598;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13f8.seed._M_dataplus._M_p != &local_13f8.seed.field_2) {
    operator_delete(local_13f8.seed._M_dataplus._M_p,
                    local_13f8.seed.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            const long filt_nr = _nr!=0 ? _nr : sub.get_output().nr();
            const long filt_nc = _nc!=0 ? _nc : sub.get_output().nc();

            long num_inputs = filt_nr*filt_nc*sub.get_output().k();
            long num_outputs = num_filters_;
            // allocate params for the filters and also for the filter bias values.
            params.set_size(num_inputs*num_filters_ + static_cast<int>(use_bias) * num_filters_);

            dlib::rand rnd(std::rand());
            randomize_parameters(params, num_inputs+num_outputs, rnd);

            filters = alias_tensor(num_filters_, sub.get_output().k(), filt_nr, filt_nc);
            if (use_bias)
            {
                biases = alias_tensor(1,num_filters_);
                // set the initial bias values to zero
                biases(params,filters.size()) = 0;
            }
        }